

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameters.cpp
# Opt level: O2

void __thiscall
ezc3d::ParametersNS::Parameters::setMandatoryParametersForSpecialGroup
          (Parameters *this,string *groupName)

{
  bool bVar1;
  int iVar2;
  Group *this_00;
  Group *this_01;
  Parameter *this_02;
  vector<double,_std::allocator<double>_> *pvVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar4;
  Parameter p;
  string local_158;
  string local_138;
  allocator<char> local_10a;
  allocator<char> local_109;
  _Vector_base<double,_std::allocator<double>_> local_108;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_e8;
  Parameter local_d0;
  
  iVar2 = std::__cxx11::string::compare((char *)groupName);
  if (iVar2 == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"ROTATION",(allocator<char> *)&local_158);
    bVar1 = isGroup(this,&local_d0._name);
    std::__cxx11::string::~string((string *)&local_d0);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"ROTATION",(allocator<char> *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"",(allocator<char> *)&local_e8);
      GroupNS::Group::Group((Group *)&local_d0,&local_158,&local_138);
      group(this,(Group *)&local_d0);
      GroupNS::Group::~Group((Group *)&local_d0);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"ROTATION",(allocator<char> *)&local_158);
    this_00 = group(this,&local_d0._name);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"USED",(allocator<char> *)&local_158);
    bVar1 = GroupNS::Group::isParameter(this_00,&local_d0._name);
    std::__cxx11::string::~string((string *)&local_d0);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"USED",(allocator<char> *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"",(allocator<char> *)&local_e8);
      GroupNS::Parameter::Parameter(&local_d0,&local_158,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      GroupNS::Parameter::set(&local_d0,0);
      GroupNS::Group::parameter(this_00,&local_d0);
      GroupNS::Parameter::~Parameter(&local_d0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"DATA_START",(allocator<char> *)&local_158);
    bVar1 = GroupNS::Group::isParameter(this_00,&local_d0._name);
    std::__cxx11::string::~string((string *)&local_d0);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"DATA_START",(allocator<char> *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"",(allocator<char> *)&local_e8);
      GroupNS::Parameter::Parameter(&local_d0,&local_158,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      local_108._M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_108._M_impl.super__Vector_impl_data._M_start._4_4_,1);
      local_158._M_dataplus._M_p = (pointer)0x0;
      local_158._M_string_length = 0;
      local_158.field_2._M_allocated_capacity = 0;
      std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
                ((vector<int,std::allocator<int>> *)&local_158,&local_108);
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      GroupNS::Parameter::set
                (&local_d0,(vector<int,_std::allocator<int>_> *)&local_158,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138);
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)&local_158);
      GroupNS::Group::parameter(this_00,&local_d0);
      GroupNS::Parameter::~Parameter(&local_d0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"RATE",(allocator<char> *)&local_158);
    bVar1 = GroupNS::Group::isParameter(this_00,&local_d0._name);
    std::__cxx11::string::~string((string *)&local_d0);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"RATE",(allocator<char> *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"",(allocator<char> *)&local_e8);
      GroupNS::Parameter::Parameter(&local_d0,&local_158,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"POINT",&local_109);
      this_01 = group(this,&local_158);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"RATE",&local_10a);
      this_02 = GroupNS::Group::parameter(this_01,&local_138);
      pvVar3 = GroupNS::Parameter::valuesAsDouble(this_02);
      local_108._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_108._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_108._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator=
                         ((vector<double,_std::allocator<double>_> *)&local_108,pvVar3);
      local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      GroupNS::Parameter::set
                (&local_d0,pvVar3,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_e8
                );
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_e8);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_108);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      GroupNS::Group::parameter(this_00,&local_d0);
      GroupNS::Parameter::~Parameter(&local_d0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"LABELS",(allocator<char> *)&local_158);
    bVar1 = GroupNS::Group::isParameter(this_00,&local_d0._name);
    std::__cxx11::string::~string((string *)&local_d0);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"LABELS",(allocator<char> *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"",(allocator<char> *)&local_e8);
      GroupNS::Parameter::Parameter(&local_d0,&local_158,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      local_158._M_dataplus._M_p = (pointer)0x0;
      local_158._M_string_length = 0;
      local_158.field_2._M_allocated_capacity = 0;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_158,
                           (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )ZEXT816(0));
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      GroupNS::Parameter::set
                (&local_d0,pvVar4,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_158);
      GroupNS::Group::parameter(this_00,&local_d0);
      GroupNS::Parameter::~Parameter(&local_d0);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,"DESCRIPTIONS",(allocator<char> *)&local_158);
    bVar1 = GroupNS::Group::isParameter(this_00,&local_d0._name);
    std::__cxx11::string::~string((string *)&local_d0);
    if (!bVar1) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_158,"DESCRIPTIONS",(allocator<char> *)&local_108);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_138,"",(allocator<char> *)&local_e8);
      GroupNS::Parameter::Parameter(&local_d0,&local_158,&local_138);
      std::__cxx11::string::~string((string *)&local_138);
      std::__cxx11::string::~string((string *)&local_158);
      local_158._M_dataplus._M_p = (pointer)0x0;
      local_158._M_string_length = 0;
      local_158.field_2._M_allocated_capacity = 0;
      pvVar4 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_158,
                           (initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )ZEXT816(0));
      local_138._M_dataplus._M_p = (pointer)0x0;
      local_138._M_string_length = 0;
      local_138.field_2._M_allocated_capacity = 0;
      GroupNS::Parameter::set
                (&local_d0,pvVar4,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_138);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_158);
      GroupNS::Group::parameter(this_00,&local_d0);
      GroupNS::Parameter::~Parameter(&local_d0);
    }
  }
  return;
}

Assistant:

void ezc3d::ParametersNS::Parameters::setMandatoryParametersForSpecialGroup(
    const std::string &groupName) {
  // Mandatory groups
  if (!groupName.compare("ROTATION")) {
    if (!isGroup("ROTATION")) {
      group(ezc3d::ParametersNS::GroupNS::Group("ROTATION"));
    }

    ezc3d::ParametersNS::GroupNS::Group &grp(group("ROTATION"));
    if (!grp.isParameter("USED")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("USED", "");
      p.set(0);
      grp.parameter(p);
    }
    if (!grp.isParameter("DATA_START")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DATA_START", "");
      p.set(std::vector<int>() = {1});
      grp.parameter(p);
    }
    if (!grp.isParameter("RATE")) {
      // Double is better as default than RATIO as RATIO is chosen in
      // priority when writing.
      ezc3d::ParametersNS::GroupNS::Parameter p("RATE", "");
      p.set(std::vector<double>() =
                group("POINT").parameter("RATE").valuesAsDouble());
      grp.parameter(p);
    }
    if (!grp.isParameter("LABELS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("LABELS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
    if (!grp.isParameter("DESCRIPTIONS")) {
      ezc3d::ParametersNS::GroupNS::Parameter p("DESCRIPTIONS", "");
      p.set(std::vector<std::string>() = {});
      grp.parameter(p);
    }
  }
}